

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O2

TValue * trace_exit_cp(lua_State *L,lua_CFunction dummy,void *ud)

{
  IRIns *ira;
  SnapShot *pSVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  uint32_t uVar5;
  CTypeID id;
  jit_State *J;
  ExitState *ex;
  SnapShot *pSVar6;
  SnapEntry *pSVar7;
  lua_State *L_00;
  IRIns *pIVar8;
  IRIns *pIVar9;
  IRIns *pIVar10;
  CTSize CVar11;
  uint32_t uVar12;
  uint uVar13;
  BloomFilter rfilt;
  ulong uVar14;
  undefined4 extraout_var;
  void *pvVar15;
  GCtab *t;
  TValue *pTVar16;
  uint8_t *puVar17;
  byte bVar18;
  uint uVar19;
  SnapShot *pSVar20;
  ulong uVar21;
  IRIns *ir;
  uint ref;
  IRIns *pIVar22;
  GCtrace *T;
  CTState *cts;
  long lVar23;
  ulong uVar24;
  TValue *local_78;
  uint32_t *local_60;
  TValue local_58;
  SnapShot *local_50;
  byte *local_48;
  undefined8 local_40;
  lua_State *local_38;
  
  *(undefined4 *)((long)L->cframe + 0x14) = 0xffffffff;
  J = *ud;
  ex = *(ExitState **)((long)ud + 8);
  uVar19 = J->exitno;
  T = (GCtrace *)(ulong)J->trace[J->parent].gcptr32;
  pSVar6 = T->snap;
  pSVar7 = T->snapmap;
  pSVar1 = pSVar6 + (ulong)uVar19 + 1;
  bVar2 = pSVar1[-1].nent;
  uVar3 = pSVar1[-1].mapofs;
  pSVar20 = (SnapShot *)&T->nsnapmap;
  if (pSVar1 != pSVar6 + T->nsnap) {
    pSVar20 = pSVar1;
  }
  uVar4 = pSVar20->mapofs;
  rfilt = snap_renamefilter(T,uVar19);
  local_48 = (byte *)(ulong)pSVar7[(ulong)uVar3 + (ulong)bVar2];
  L_00 = J->L;
  *(SnapEntry *)(((ulong)L_00->cframe & 0xfffffffffffffffc) + 0x1c) =
       pSVar7[(ulong)uVar3 + (ulong)bVar2] + 4;
  local_78 = L_00->base;
  bVar18 = pSVar1[-1].topslot;
  if ((TValue *)(ulong)(L_00->maxstack).ptr32 <= local_78 + bVar18) {
    L_00->top = local_78 + *(byte *)((ulong)*(uint *)((ulong)local_78[-1].u32.lo + 0x10) - 0x39);
    lj_state_growstack(L_00,(uint)bVar18 -
                            (uint)*(byte *)((ulong)*(uint *)((ulong)local_78[-1].u32.lo + 0x10) -
                                           0x39));
    local_78 = L_00->base;
  }
  local_50 = pSVar6 + uVar19;
  local_60 = pSVar7 + (uVar4 - 1);
  uVar5 = *(uint32_t *)((long)local_78 + -4);
  local_78 = local_78 + -1;
  uVar24 = 0;
  do {
    if (uVar24 == bVar2) {
      uVar19 = *local_48 - 0x3c;
      if (((uVar19 < 10) && ((0x20bU >> (uVar19 & 0x1f) & 1) != 0)) || (0x54 < *local_48)) {
        puVar17 = &local_50->nslots;
      }
      else {
        local_78 = L_00->base;
        puVar17 = (uint8_t *)((ulong)*(uint *)((ulong)local_78[-1].u32.lo + 0x10) - 0x39);
      }
      L_00->top = local_78 + *puVar17;
      *(byte **)((long)ud + 0x10) = local_48;
      return (TValue *)0x0;
    }
    uVar13 = pSVar7[uVar3 + uVar24];
    if ((uVar13 >> 0x12 & 1) == 0) {
      pTVar16 = local_78 + (uVar13 >> 0x18);
      ref = uVar13 & 0xffff;
      uVar21 = (ulong)ref;
      pIVar22 = T->ir;
      if (*(char *)((long)pIVar22 + uVar21 * 8 + 6) == -3) {
        ira = pIVar22 + uVar21;
        uVar14 = 0;
        do {
          if (uVar24 == uVar14) {
            if ((ira->field_1).o - 0x50 < 2) {
              local_38 = J->L;
              cts = (CTState *)(ulong)*(uint *)((ulong)(local_38->glref).ptr32 + 0xfc);
              cts->L = local_38;
              id = pIVar22[(ira->field_0).op1].field_1.op12;
              CVar11 = lj_ctype_size(cts,id);
              local_40 = CONCAT44(extraout_var,CVar11);
              pvVar15 = lj_mem_newgco(local_38,CVar11 + 8);
              *(undefined1 *)((long)pvVar15 + 5) = 10;
              *(short *)((long)pvVar15 + 6) = (short)id;
              (pTVar16->u32).lo = (uint32_t)pvVar15;
              (pTVar16->field_2).it = 0xfffffff5;
              if ((ira->field_1).o == 'Q') {
                snap_restoredata(T,ex,uVar19,rfilt,(uint)(ira->field_0).op2,
                                 (void *)((long)pvVar15 + 8),(CTSize)local_40);
              }
              else {
                uVar4 = T->snap[uVar19].ref;
                pIVar8 = T->ir;
                pIVar22 = pIVar22 + uVar21;
                while (pIVar10 = pIVar22, pIVar22 = pIVar10 + 1, pIVar22 < pIVar8 + uVar4) {
                  if (*(char *)((long)pIVar10 + 0xe) == -2) {
                    if ((ulong)*(byte *)((long)pIVar10 + 0xf) == 0xff) {
                      uVar13 = snap_sunk_store2(T,ira,pIVar22);
                    }
                    else {
                      uVar13 = (uint)(pIVar22 == ira + *(byte *)((long)pIVar10 + 0xf));
                    }
                    if (uVar13 != 0) {
                      CVar11 = 8;
                      if ((0x604208U >> (*(uint *)((long)pIVar10 + 0xc) & 0x1f) & 1) == 0) {
                        bVar18 = ((byte)*(uint *)((long)pIVar10 + 0xc) & 0x1f) - 0xf;
                        CVar11 = 4;
                        if (bVar18 < 4) {
                          CVar11 = *(CTSize *)(&DAT_0014f250 + (ulong)bVar18 * 4);
                        }
                      }
                      pIVar9 = T->ir;
                      uVar21 = (ulong)*(ushort *)
                                       ((long)pIVar9 + (ulong)(pIVar22->field_0).op1 * 8 + 2);
                      if (*(char *)((long)pIVar9 + uVar21 * 8 + 5) == '\x1c') {
                        lVar23 = *(long *)(ulong)pIVar9[uVar21].field_1.op12;
                      }
                      else {
                        lVar23 = (long)(int)pIVar9[uVar21].field_1.op12;
                      }
                      snap_restoredata(T,ex,uVar19,rfilt,(uint)*(ushort *)((long)pIVar10 + 10),
                                       (void *)(lVar23 + (long)pvVar15),CVar11);
                    }
                  }
                }
              }
            }
            else {
              if ((ira->field_1).o == 0x4e) {
                t = lj_tab_new(J->L,(uint)(ira->field_0).op1,(uint)(ira->field_0).op2);
              }
              else {
                t = lj_tab_dup(J->L,(GCtab *)(ulong)pIVar22[(ira->field_0).op1].field_1.op12);
              }
              (pTVar16->u32).lo = (uint32_t)t;
              (pTVar16->field_2).it = 0xfffffff4;
              uVar4 = T->snap[uVar19].ref;
              pIVar8 = T->ir;
              pIVar22 = pIVar22 + uVar21;
              while (pIVar10 = pIVar22, pIVar22 = pIVar10 + 1, pIVar22 < pIVar8 + uVar4) {
                if (*(char *)((long)pIVar10 + 0xe) == -2) {
                  if ((ulong)*(byte *)((long)pIVar10 + 0xf) == 0xff) {
                    uVar13 = snap_sunk_store2(T,ira,pIVar22);
                  }
                  else {
                    uVar13 = (uint)(pIVar22 == ira + *(byte *)((long)pIVar10 + 0xf));
                  }
                  if (uVar13 != 0) {
                    pIVar9 = T->ir;
                    if (*(char *)((long)pIVar9 + (ulong)(pIVar22->field_0).op1 * 8 + 5) == '>') {
                      snap_restoreval(J,T,ex,uVar19,rfilt,(uint)*(ushort *)((long)pIVar10 + 10),
                                      &local_58);
                      (t->metatable).gcptr32 = (uint32_t)local_58.field_2.field_0;
                    }
                    else {
                      ir = pIVar9 + *(ushort *)
                                     ((long)pIVar9 + (ulong)(pIVar22->field_0).op1 * 8 + 2);
                      if ((ir->field_1).o == '\x1d') {
                        ir = pIVar9 + (ir->field_0).op1;
                      }
                      lj_ir_kvalue(J->L,&local_58,ir);
                      pTVar16 = lj_tab_set(J->L,t,&local_58);
                      snap_restoreval(J,T,ex,uVar19,rfilt,(uint)*(ushort *)((long)pIVar10 + 10),
                                      pTVar16);
                    }
                  }
                }
              }
            }
            goto LAB_001116b1;
          }
          lVar23 = uVar3 + uVar14;
          uVar14 = uVar14 + 1;
        } while ((pSVar7[lVar23] & 0xffff) != ref);
        *pTVar16 = local_78[pSVar7[lVar23] >> 0x18];
      }
      else {
        snap_restoreval(J,T,ex,uVar19,rfilt,ref,pTVar16);
        if ((uVar13 & 0x30000) != 0) {
          uVar12 = uVar5;
          if (0xffffff < uVar13) {
            uVar12 = *local_60;
            local_60 = local_60 + -1;
          }
          (pTVar16->field_2).it = uVar12;
          L_00->base = pTVar16 + 1;
        }
      }
    }
LAB_001116b1:
    uVar24 = uVar24 + 1;
  } while( true );
}

Assistant:

static TValue *trace_exit_cp(lua_State *L, lua_CFunction dummy, void *ud)
{
  ExitDataCP *exd = (ExitDataCP *)ud;
  cframe_errfunc(L->cframe) = -1;  /* Inherit error function. */
  exd->pc = lj_snap_restore(exd->J, exd->exptr);
  UNUSED(dummy);
  return NULL;
}